

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O3

void __thiscall CPropertyData::CPropertyData(CPropertyData *this,CPropertyData *src)

{
  ON_wString::ON_wString(&this->m_sName);
  ::ON_XMLVariant::ON_XMLVariant(&this->m_value);
  this->m_iRefCount = 1;
  *(undefined8 *)((long)&(this->m_mutex).super___recursive_mutex_base._M_mutex + 0x10) = 0;
  (this->m_mutex).super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_mutex).super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_mutex).super___recursive_mutex_base._M_mutex + 8) = 0;
  (this->m_mutex).super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_mutex).super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  LOCK();
  g_lPropertyCount.super___atomic_base<long>._M_i =
       (__atomic_base<long>)((long)g_lPropertyCount.super___atomic_base<long>._M_i + 1);
  UNLOCK();
  ON_wString::operator=(&this->m_sName,&src->m_sName);
  ::ON_XMLVariant::operator=(&this->m_value,&src->m_value);
  return;
}

Assistant:

CPropertyData(const CPropertyData& src) { g_lPropertyCount++; m_sName = src.m_sName; m_value = src.m_value; }